

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

char * cmOutputConverter::Shell__SkipMakeVariables(char *c)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
LAB_00191ab5:
  pcVar3 = c;
  if (*pcVar3 != '$') {
    return pcVar3;
  }
  if (pcVar3[1] != '(') {
    return pcVar3;
  }
  c = pcVar3 + 3;
  do {
    cVar1 = c[-1];
    if (cVar1 != '_') {
      if (cVar1 == '\0') {
        return pcVar3;
      }
      iVar2 = isalpha((int)cVar1);
      if (iVar2 == 0) break;
    }
    c = c + 1;
  } while( true );
  if (cVar1 != ')') {
    return pcVar3;
  }
  goto LAB_00191ab5;
}

Assistant:

const char* cmOutputConverter::Shell__SkipMakeVariables(const char* c)
{
  while (*c == '$' && *(c + 1) == '(') {
    const char* skip = c + 2;
    while (Shell__CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if (*skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}